

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratiotest.cpp
# Opt level: O0

Instance * ratiotest_relax_instance(Runtime *runtime)

{
  bool bVar1;
  reference pdVar2;
  long in_RSI;
  Instance *in_RDI;
  double dVar3;
  double dVar4;
  double *bound_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<double,_std::allocator<double>_> *__range1_3;
  double *bound_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<double,_std::allocator<double>_> *__range1_2;
  double *bound_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<double,_std::allocator<double>_> *__range1_1;
  double *bound;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  Instance *relaxed_instance;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff38;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  *in_stack_ffffffffffffff40;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff78;
  Instance *in_stack_ffffffffffffff80;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_68;
  vector<double,_std::allocator<double>_> *local_60;
  double *local_58;
  double *local_50;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_48;
  vector<double,_std::allocator<double>_> *local_40;
  double *local_38;
  double *local_30;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_28;
  vector<double,_std::allocator<double>_> *local_20;
  undefined1 local_11;
  long local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  Instance::Instance(in_stack_ffffffffffffff80,(Instance *)in_stack_ffffffffffffff78._M_current);
  local_20 = &in_RDI->con_lo;
  local_28._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff38);
  local_30 = (double *)std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff38);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff40,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)in_stack_ffffffffffffff38), bVar1) {
    local_38 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_28);
    dVar4 = *local_38;
    dVar3 = std::numeric_limits<double>::infinity();
    if ((dVar4 != -dVar3) || (NAN(dVar4) || NAN(-dVar3))) {
      *local_38 = *local_38 - *(double *)(local_10 + 0x810);
    }
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_28);
  }
  local_40 = &in_RDI->con_up;
  local_48._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff38);
  local_50 = (double *)std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff38);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff40,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)in_stack_ffffffffffffff38), bVar1) {
    local_58 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator*(&local_48);
    dVar4 = *local_58;
    dVar3 = std::numeric_limits<double>::infinity();
    if ((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) {
      *local_58 = *(double *)(local_10 + 0x810) + *local_58;
    }
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_48);
  }
  local_60 = &in_RDI->var_lo;
  local_68._M_current =
       (double *)std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff38);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff38);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff40,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)in_stack_ffffffffffffff38), bVar1) {
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&local_68);
    in_stack_ffffffffffffff40 =
         (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)*pdVar2;
    dVar4 = std::numeric_limits<double>::infinity();
    if (((double)in_stack_ffffffffffffff40 != -dVar4) ||
       (NAN((double)in_stack_ffffffffffffff40) || NAN(-dVar4))) {
      *pdVar2 = *pdVar2 - *(double *)(local_10 + 0x810);
    }
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_68);
  }
  std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff38);
  std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff38);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff40,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)in_stack_ffffffffffffff38), bVar1) {
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )&stack0xffffffffffffff78);
    in_stack_ffffffffffffff38 = (vector<double,_std::allocator<double>_> *)*pdVar2;
    dVar4 = std::numeric_limits<double>::infinity();
    if (((double)in_stack_ffffffffffffff38 != dVar4) ||
       (NAN((double)in_stack_ffffffffffffff38) || NAN(dVar4))) {
      *pdVar2 = *(double *)(local_10 + 0x810) + *pdVar2;
    }
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               &stack0xffffffffffffff78);
  }
  return in_RDI;
}

Assistant:

Instance ratiotest_relax_instance(Runtime& runtime) {
  Instance relaxed_instance = runtime.instance;
  for (double& bound : relaxed_instance.con_lo) {
    if (bound != -std::numeric_limits<double>::infinity()) {
      bound -= runtime.settings.ratiotest_d;
    }
  }

  for (double& bound : relaxed_instance.con_up) {
    if (bound != std::numeric_limits<double>::infinity()) {
      bound += runtime.settings.ratiotest_d;
    }
  }

  for (double& bound : relaxed_instance.var_lo) {
    if (bound != -std::numeric_limits<double>::infinity()) {
      bound -= runtime.settings.ratiotest_d;
    }
  }

  for (double& bound : relaxed_instance.var_up) {
    if (bound != std::numeric_limits<double>::infinity()) {
      bound += runtime.settings.ratiotest_d;
    }
  }
  return relaxed_instance;
}